

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::pushSource(Preprocessor *this,string_view source,string_view name)

{
  SourceBuffer buffer_00;
  SourceLocation location;
  SourceBuffer buffer;
  
  SourceManager::assignText
            (&buffer,this->sourceManager,source,(SourceLocation)0x0,(SourceLibrary *)0x0);
  buffer_00._28_4_ = buffer._28_4_;
  buffer_00.id.id = buffer.id.id;
  buffer_00.data._M_str = buffer.data._M_str;
  buffer_00.data._M_len = buffer.data._M_len;
  buffer_00.library = buffer.library;
  pushSource(this,buffer_00);
  if (name._M_len != 0) {
    location._0_4_ = buffer.id.id & 0xfffffff;
    location._4_4_ = 0;
    SourceManager::addLineDirective(this->sourceManager,location,2,name,'\0');
  }
  return;
}

Assistant:

void Preprocessor::pushSource(std::string_view source, std::string_view name) {
    auto buffer = sourceManager.assignText(source);
    pushSource(buffer);

    if (!name.empty())
        sourceManager.addLineDirective(SourceLocation(buffer.id, 0), 2, name, 0);
}